

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

void rationSplitter(QSplitter *splitter,float ratio)

{
  int iVar1;
  int iVar2;
  QArrayData *local_38;
  int *local_30;
  undefined8 local_28;
  
  iVar1 = QSplitter::orientation();
  iVar1 = (*(int *)(*(long *)(splitter + 0x20) + 0x1c + (ulong)(iVar1 != 1) * 4) -
          *(int *)(*(long *)(splitter + 0x20) + 0x14 + (ulong)(iVar1 != 1) * 4)) + 1;
  iVar2 = (int)((float)iVar1 * ratio);
  local_30 = (int *)QArrayData::allocate(&local_38,4,8,2,KeepSize);
  *local_30 = iVar2;
  local_30[1] = iVar1 - iVar2;
  local_28 = 2;
  QSplitter::setSizes((QList *)splitter);
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,4,8);
    }
  }
  return;
}

Assistant:

void rationSplitter(QSplitter &splitter, float ratio) {
    auto total = splitter.orientation() == Qt::Horizontal ? splitter.width() : splitter.height();
    auto first = (int)(total * ratio);
    auto second = total - first;
    splitter.setSizes({ first, second });
}